

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O0

int Wlc_NtkNodeDeref_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pNode,Vec_Bit_t *vUnmark)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pNode_00;
  int local_34;
  int Counter;
  int Fanin;
  int i;
  Vec_Bit_t *vUnmark_local;
  Wlc_Obj_t *pNode_local;
  Wlc_Ntk_t *p_local;
  
  local_34 = 1;
  iVar1 = Wlc_ObjIsCi(pNode);
  if (iVar1 == 0) {
    iVar1 = Wlc_ObjId(p,pNode);
    Vec_BitWriteEntry(vUnmark,iVar1,1);
    for (Counter = 0; iVar1 = Wlc_ObjFaninNum(pNode), Counter < iVar1; Counter = Counter + 1) {
      iVar1 = Wlc_ObjFaninId(pNode,Counter);
      Vec_IntAddToEntry(&p->vRefs,iVar1,-1);
      iVar2 = Vec_IntEntry(&p->vRefs,iVar1);
      if (iVar2 == 0) {
        pNode_00 = Wlc_NtkObj(p,iVar1);
        iVar1 = Wlc_NtkNodeDeref_rec(p,pNode_00,vUnmark);
        local_34 = iVar1 + local_34;
      }
    }
    p_local._4_4_ = local_34;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int Wlc_NtkNodeDeref_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pNode, Vec_Bit_t * vUnmark )
{
    int i, Fanin, Counter = 1;
    if ( Wlc_ObjIsCi(pNode) )
        return 0;
    Vec_BitWriteEntry( vUnmark, Wlc_ObjId(p, pNode), 1 );
    Wlc_ObjForEachFanin( pNode, Fanin, i )
    {
        Vec_IntAddToEntry( &p->vRefs, Fanin, -1 );
        if ( Vec_IntEntry(&p->vRefs, Fanin) == 0 )
            Counter += Wlc_NtkNodeDeref_rec( p, Wlc_NtkObj(p, Fanin), vUnmark );
    }
    return Counter;
}